

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,bool,duckdb::TernaryLambdaWrapper,bool(*)(duckdb::string_t,duckdb::string_t,duckdb::string_t)>
               (string_t *adata,string_t *bdata,string_t *cdata,bool *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,_func_bool_string_t_string_t_string_t *fun)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ulong uVar9;
  ulong uVar10;
  idx_t idx_in_entry;
  ulong uVar11;
  string_t sVar12;
  string_t sVar13;
  string_t sVar14;
  string_t sVar15;
  string_t sVar16;
  string_t sVar17;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  SelectionVector *local_40;
  idx_t local_38;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    if (count != 0) {
      uVar11 = 0;
      do {
        uVar6 = uVar11;
        if (asel->sel_vector != (sel_t *)0x0) {
          uVar6 = (ulong)asel->sel_vector[uVar11];
        }
        uVar9 = uVar11;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)bsel->sel_vector[uVar11];
        }
        uVar10 = uVar11;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar10 = (ulong)csel->sel_vector[uVar11];
        }
        sVar12.value.pointer.ptr = adata[uVar6].value.pointer.ptr;
        sVar12.value._0_8_ = *(undefined8 *)&adata[uVar6].value;
        sVar14.value.pointer.ptr = bdata[uVar9].value.pointer.ptr;
        sVar14.value._0_8_ = *(undefined8 *)&bdata[uVar9].value;
        sVar16.value.pointer.ptr = cdata[uVar10].value.pointer.ptr;
        sVar16.value._0_8_ = *(undefined8 *)&cdata[uVar10].value;
        bVar5 = (*fun)(sVar12,sVar14,sVar16);
        result_data[uVar11] = bVar5;
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else if (count != 0) {
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar11 = 0;
    local_40 = asel;
    do {
      uVar6 = uVar11;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)asel->sel_vector[uVar11];
      }
      uVar9 = uVar11;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)bsel->sel_vector[uVar11];
      }
      uVar10 = uVar11;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)csel->sel_vector[uVar11];
      }
      puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0))
          && ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0))))
         && ((puVar1 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)))
         ) {
        sVar13.value.pointer.ptr = adata[uVar6].value.pointer.ptr;
        sVar13.value._0_8_ = *(undefined8 *)&adata[uVar6].value;
        sVar15.value.pointer.ptr = bdata[uVar9].value.pointer.ptr;
        sVar15.value._0_8_ = *(undefined8 *)&bdata[uVar9].value;
        sVar17.value.pointer.ptr = cdata[uVar10].value.pointer.ptr;
        sVar17.value._0_8_ = *(undefined8 *)&cdata[uVar10].value;
        bVar5 = (*fun)(sVar13,sVar15,sVar17);
        result_data[uVar11] = bVar5;
      }
      else {
        _Var8._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var8._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var4 = p_Stack_50;
          peVar3 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_48);
          _Var8._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var8._M_head_impl;
          asel = local_40;
        }
        bVar2 = (byte)uVar11 & 0x3f;
        _Var8._M_head_impl[uVar11 >> 6] =
             _Var8._M_head_impl[uVar11 >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      uVar11 = uVar11 + 1;
    } while (count != uVar11);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}